

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  bool bVar1;
  size_t sVar2;
  runtime_error *this_00;
  LargestUInt in_RDX;
  char *pcVar3;
  char *__s;
  
  switch(this->field_0x8) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    __s = "";
    break;
  case 1:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,in_RDX);
    return __return_storage_ptr__;
  case 2:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,in_RDX);
    return __return_storage_ptr__;
  case 3:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)this,(this->value_).real_);
    return __return_storage_ptr__;
  case 4:
    __s = "";
    if ((this->value_).string_ != (char *)0x0) {
      __s = (this->value_).string_;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(__s);
    pcVar3 = __s + sVar2;
    break;
  case 5:
    bVar1 = (this->value_).bool_;
    __s = "false";
    if ((ulong)bVar1 != 0) {
      __s = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = __s + ((ulong)bVar1 ^ 5);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Type is not convertible to string");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
    return value_.string_ ? value_.string_ : "";
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}